

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

void objsetign(mcmcxdef *mctx,objnum objn)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  uchar *puVar4;
  int iVar5;
  short *psVar6;
  uint uVar7;
  short *psVar8;
  
  puVar4 = mcmlck(mctx,objn);
  uVar2 = *(ushort *)(puVar4 + 2);
  iVar5 = (uint)*(ushort *)(puVar4 + 6) - (uint)*(ushort *)(puVar4 + 10);
  if (iVar5 != 0) {
    uVar3 = *(ushort *)(puVar4 + 4);
    psVar6 = (short *)(puVar4 + *(ushort *)(puVar4 + 0xc));
    do {
      uVar7 = (uint)*(ushort *)(puVar4 + 10);
      if (*(ushort *)(puVar4 + 10) != 0) {
        psVar8 = (short *)(puVar4 + (ulong)uVar3 * 2 + 0xe);
        do {
          if (*psVar8 == *psVar6) {
            *(byte *)((long)psVar8 + 5) = *(byte *)((long)psVar8 + 5) | 2;
            break;
          }
          psVar8 = (short *)((long)psVar8 + (ulong)*(ushort *)((long)psVar8 + 3) + 6);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      psVar6 = (short *)((long)psVar6 + (ulong)*(ushort *)((long)psVar6 + 3) + 6);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  puVar1 = (ushort *)
           ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmoflg +
           (ulong)((mctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck(mctx,objn);
  if ((uVar2 & 2) != 0) {
    objindx(mctx,objn);
    return;
  }
  return;
}

Assistant:

void objsetign(mcmcxdef *mctx, objnum objn)
{
    objdef *objptr;
    prpdef *mut;
    prpdef *p;
    int     statcnt;
    int     cnt;
    int     indexed;
    prpdef *p1;
    
    objptr = (objdef *)mcmlck(mctx, (mcmon)objn);
    p1 = objprp(objptr);
    indexed = objflg(objptr) & OBJFINDEX;

    /* go through mutables, and set ignore on duplicates in non-mutables */
    for (mut = (prpdef *)(objptr + objrst(objptr)),
         cnt = objnprop(objptr) - objstat(objptr) ; cnt ;
         mut = objpnxt(mut), --cnt)
    {
        for (p = p1, statcnt = objstat(objptr) ; statcnt ;
             p = objpnxt(p), --statcnt)
        {
            /* if this static prop matches a mutable prop, ignore it */
            if (prpprop(p) == prpprop(mut))
            {
                prpflg(p) |= PRPFIGN;
                break;
            }
        }
    }
    
    mcmtch(mctx, (mcmon)objn);
    mcmunlck(mctx, (mcmon)objn);
    if (indexed) objindx(mctx, objn);
}